

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O1

void duckdb::Prefix::Reduce(ART *art,Node *node,idx_t pos)

{
  idx_t iVar1;
  ulong uVar2;
  ulong uVar3;
  Prefix prefix;
  Prefix local_38;
  
  Prefix(&local_38,art,(Node)(node->super_IndexPointer).data,false,false);
  if ((ulong)local_38.data[art->prefix_count] - 1 == pos) {
    iVar1 = ((local_38.ptr)->super_IndexPointer).data;
    ((local_38.ptr)->super_IndexPointer).data = 0;
    Node::Free(art,node);
    (node->super_IndexPointer).data = iVar1;
  }
  else {
    uVar2 = (ulong)art->prefix_count;
    if (pos + 1 != uVar2) {
      uVar3 = 0;
      do {
        local_38.data[uVar3] = local_38.data[pos + 1 + uVar3];
        uVar3 = uVar3 + 1;
        uVar2 = (ulong)art->prefix_count;
      } while (uVar3 < uVar2 + ~pos);
    }
    local_38.data[uVar2] = local_38.data[uVar2] + ~(byte)pos;
    Append(&local_38,art,(Node)((local_38.ptr)->super_IndexPointer).data);
  }
  return;
}

Assistant:

void Prefix::Reduce(ART &art, Node &node, const idx_t pos) {
	D_ASSERT(node.HasMetadata());
	D_ASSERT(pos < Count(art));

	Prefix prefix(art, node);
	if (pos == idx_t(prefix.data[Count(art)] - 1)) {
		auto next = *prefix.ptr;
		prefix.ptr->Clear();
		Node::Free(art, node);
		node = next;
		return;
	}

	for (idx_t i = 0; i < Count(art) - pos - 1; i++) {
		prefix.data[i] = prefix.data[pos + i + 1];
	}

	prefix.data[Count(art)] -= pos + 1;
	prefix.Append(art, *prefix.ptr);
}